

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_CreateSubscription
               (UA_Server *server,UA_Session *session,UA_CreateSubscriptionRequest *request,
               UA_CreateSubscriptionResponse *response)

{
  UA_UInt32 UVar1;
  UA_Subscription *pUVar2;
  long lVar3;
  UA_Subscription *subscription;
  
  UVar1 = response->subscriptionId;
  pUVar2 = (UA_Subscription *)malloc(0x80);
  subscription = (UA_Subscription *)0x0;
  if (pUVar2 != (UA_Subscription *)0x0) {
    pUVar2->session = session;
    pUVar2->subscriptionID = UVar1;
    pUVar2->maxKeepAliveCount = 0;
    pUVar2->publishingEnabled = false;
    pUVar2->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    pUVar2->sequenceNumber = 0;
    pUVar2->currentKeepAliveCount = 0;
    pUVar2->currentLifetimeCount = 0;
    pUVar2->lastMonitoredItemId = 0;
    (pUVar2->publishJobGuid).data1 = 0;
    (pUVar2->publishJobGuid).data2 = 0;
    (pUVar2->publishJobGuid).data3 = 0;
    (pUVar2->publishJobGuid).data4[0] = '\0';
    (pUVar2->publishJobGuid).data4[1] = '\0';
    (pUVar2->publishJobGuid).data4[2] = '\0';
    (pUVar2->publishJobGuid).data4[3] = '\0';
    *(undefined8 *)((pUVar2->publishJobGuid).data4 + 1) = 0;
    (pUVar2->monitoredItems).lh_first = (UA_MonitoredItem *)0x0;
    (pUVar2->retransmissionQueue).tqh_first = (UA_NotificationMessageEntry *)0x0;
    (pUVar2->retransmissionQueue).tqh_last = &(pUVar2->retransmissionQueue).tqh_first;
    pUVar2->retransmissionQueueSize = 0;
    subscription = pUVar2;
  }
  if (subscription == (UA_Subscription *)0x0) {
    UVar1 = 0x80030000;
    lVar3 = 0xc;
  }
  else {
    UVar1 = session->lastSubscriptionID + 1;
    session->lastSubscriptionID = UVar1;
    subscription->subscriptionID = UVar1;
    pUVar2 = (session->serverSubscriptions).lh_first;
    (subscription->listEntry).le_next = pUVar2;
    if (pUVar2 != (UA_Subscription *)0x0) {
      (pUVar2->listEntry).le_prev = (UA_Subscription **)subscription;
    }
    (session->serverSubscriptions).lh_first = subscription;
    (subscription->listEntry).le_prev = &(session->serverSubscriptions).lh_first;
    subscription->publishingEnabled = request->publishingEnabled;
    setSubscriptionSettings
              (server,subscription,request->requestedPublishingInterval,
               request->requestedLifetimeCount,request->requestedMaxKeepAliveCount,
               request->maxNotificationsPerPublish,request->priority);
    UVar1 = subscription->maxKeepAliveCount;
    subscription->currentKeepAliveCount = UVar1;
    response->subscriptionId = subscription->subscriptionID;
    response->revisedPublishingInterval = subscription->publishingInterval;
    response->revisedLifetimeCount = subscription->lifeTimeCount;
    lVar3 = 0x9c;
  }
  *(UA_UInt32 *)((long)&(response->responseHeader).timestamp + lVar3) = UVar1;
  return;
}

Assistant:

void
Service_CreateSubscription(UA_Server *server, UA_Session *session,
                           const UA_CreateSubscriptionRequest *request,
                           UA_CreateSubscriptionResponse *response) {
    /* Create the subscription */
    UA_Subscription *newSubscription = UA_Subscription_new(session, response->subscriptionId);
    if(!newSubscription) {
        UA_LOG_DEBUG_SESSION(server->config.logger, session,
                             "Processing CreateSubscriptionRequest failed");
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    newSubscription->subscriptionID = UA_Session_getUniqueSubscriptionID(session);
    UA_Session_addSubscription(session, newSubscription);

    /* Set the subscription parameters */
    newSubscription->publishingEnabled = request->publishingEnabled;
    setSubscriptionSettings(server, newSubscription, request->requestedPublishingInterval,
                            request->requestedLifetimeCount, request->requestedMaxKeepAliveCount,
                            request->maxNotificationsPerPublish, request->priority);
    newSubscription->currentKeepAliveCount = newSubscription->maxKeepAliveCount; /* set settings first */

    /* Prepare the response */
    response->subscriptionId = newSubscription->subscriptionID;
    response->revisedPublishingInterval = newSubscription->publishingInterval;
    response->revisedLifetimeCount = newSubscription->lifeTimeCount;
    response->revisedMaxKeepAliveCount = newSubscription->maxKeepAliveCount;

    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "CreateSubscriptionRequest: Created Subscription %u "
                         "with a publishing interval of %f ms", response->subscriptionId,
                         newSubscription->publishingInterval);
}